

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_flow_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  long *plVar1;
  gtoken_t gVar2;
  void *pvVar3;
  void *pvVar4;
  gnode_binary_expr_t *expr;
  long lVar5;
  long lVar6;
  gnode_t *pgVar7;
  
  pgVar7 = node->cond;
  if (((pgVar7 != (gnode_t *)0x0) && (pgVar7->tag == NODE_BINARY_EXPR)) && (pgVar7[1].tag == 0x45))
  {
    report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar7,"Assignment not allowed here");
  }
  gVar2 = (node->base).token.type;
  if (gVar2 == TOK_OP_TERNARY) {
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    pgVar7 = node->elsestmt;
LAB_0011c5a1:
    gvisit(self,pgVar7);
    return;
  }
  if (gVar2 == TOK_KEY_SWITCH) {
    pvVar4 = self->data;
    lVar5 = *(long *)((long)pvVar4 + 8);
    if (lVar5 == *(long *)((long)pvVar4 + 0x10)) {
      lVar6 = 8;
      if (lVar5 != 0) {
        lVar6 = lVar5 * 2;
      }
      *(long *)((long)pvVar4 + 0x10) = lVar6;
      pvVar3 = realloc(*(void **)((long)pvVar4 + 0x18),lVar6 * 2);
      pvVar4 = self->data;
      *(void **)((long)pvVar4 + 0x18) = pvVar3;
      lVar5 = *(long *)((long)pvVar4 + 8);
    }
    else {
      pvVar3 = *(void **)((long)pvVar4 + 0x18);
    }
    *(long *)((long)pvVar4 + 8) = lVar5 + 1;
    *(undefined2 *)((long)pvVar3 + lVar5 * 2) = 0xf;
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    plVar1 = (long *)((long)self->data + 8);
    *plVar1 = *plVar1 + -1;
  }
  else if (gVar2 == TOK_KEY_IF) {
    gvisit(self,node->cond);
    gvisit(self,node->stmt);
    pgVar7 = node->elsestmt;
    if (pgVar7 != (gnode_t *)0x0) goto LAB_0011c5a1;
  }
  return;
}

Assistant:

static void visit_flow_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH) || (type == TOK_OP_TERNARY));

    if (type == TOK_KEY_IF) {
        visit_flow_if_stmt(self, node);
    } else if (type == TOK_KEY_SWITCH) {
        visit_flow_switch_stmt(self, node);
    } else if (type == TOK_OP_TERNARY) {
        visit_flow_ternary_stmt(self, node);
    }
}